

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

s3wid_t dict_wordid(dict_t *d,char *word)

{
  int32 iVar1;
  s3wid_t local_24;
  char *pcStack_20;
  int32 w;
  char *word_local;
  dict_t *d_local;
  
  pcStack_20 = word;
  word_local = (char *)d;
  if (d == (dict_t *)0x0) {
    __assert_fail("d",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                  ,0x191,"s3wid_t dict_wordid(dict_t *, const char *)");
  }
  if (word != (char *)0x0) {
    iVar1 = hash_table_lookup_int32(d->ht,word,&local_24);
    if (iVar1 < 0) {
      d_local._4_4_ = -1;
    }
    else {
      d_local._4_4_ = local_24;
    }
    return d_local._4_4_;
  }
  __assert_fail("word",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                ,0x192,"s3wid_t dict_wordid(dict_t *, const char *)");
}

Assistant:

s3wid_t
dict_wordid(dict_t *d, const char *word)
{
    int32 w;

    assert(d);
    assert(word);

    if (hash_table_lookup_int32(d->ht, word, &w) < 0)
        return (BAD_S3WID);
    return w;
}